

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h261.c
# Opt level: O1

int h261_block(bitstream *str,int32_t *block,int intra)

{
  bool bVar1;
  vs_vlc_val *pvVar2;
  int iVar3;
  int iVar4;
  vs_vlc_val *pvVar5;
  uint uVar6;
  long lVar7;
  vs_vlc_val *tab;
  uint uVar8;
  uint uVar9;
  vs_vlc_val *pvVar10;
  int iVar11;
  uint32_t val;
  uint32_t sign;
  uint32_t eb;
  uint32_t local_48;
  uint local_44;
  int32_t *local_40;
  uint local_38;
  uint local_34;
  
  local_40 = block;
  if (intra == 0) {
    iVar11 = 0;
    goto LAB_001024f3;
  }
  local_48 = *block;
  if (str->dir == VS_ENCODE) {
    if (0xffffff01 < local_48 - 0xff) {
      if (local_48 == 0x80) {
        local_48 = 0xff;
      }
      goto LAB_00102489;
    }
    h261_block_cold_2();
LAB_0010278b:
    iVar11 = 0;
    bVar1 = false;
  }
  else {
LAB_00102489:
    iVar3 = vs_u(str,&local_48,8);
    iVar11 = 0;
    bVar1 = false;
    if (iVar3 == 0) {
      bVar1 = true;
      iVar11 = 1;
      if (str->dir == VS_DECODE) {
        if ((local_48 & 0xffffff7f) == 0) {
          h261_block_cold_1();
          goto LAB_0010278b;
        }
        if (local_48 == 0xff) {
          local_48 = 0x80;
        }
        *block = local_48;
      }
    }
  }
  if (!bVar1) {
    return 1;
  }
LAB_001024f3:
  iVar3 = 1;
  do {
    tab = block_vlc;
    if (iVar11 == 0) {
      tab = block_0_vlc;
    }
    if (str->dir == VS_ENCODE) {
      local_44 = 0;
      if (iVar11 < 0x40) {
        local_44 = 0x40 - iVar11;
        lVar7 = 0;
        do {
          if (local_40[iVar11 + lVar7] != 0) {
            local_44 = (uint)lVar7;
            iVar11 = iVar11 + local_44;
            goto LAB_0010255f;
          }
          lVar7 = lVar7 + 1;
        } while (0x40 - (long)iVar11 != lVar7);
        iVar11 = 0x40;
      }
LAB_0010255f:
      if (iVar11 == 0x40) {
        local_48 = 0;
        iVar11 = 0x40;
        goto LAB_001025e3;
      }
      uVar6 = local_40[iVar11];
      uVar9 = -uVar6;
      if (0 < (int)uVar6) {
        uVar9 = uVar6;
      }
      if (uVar9 < 0x80) {
        local_48 = uVar9 | local_44 << 0xc;
        local_38 = uVar6 >> 0x1f;
        pvVar5 = tab;
        do {
          pvVar10 = pvVar5;
          if (pvVar5->val == local_48) break;
          pvVar10 = pvVar5 + 1;
          pvVar2 = pvVar5 + 1;
          pvVar5 = pvVar10;
        } while (pvVar2->blen != 0);
        if (local_48 != (pvVar10->val == 0)) {
          local_48 = 0xfffff;
        }
        local_34 = uVar6 & 0xff;
        iVar11 = iVar11 + 1;
        goto LAB_001025e3;
      }
      h261_block_cold_3();
      iVar3 = 1;
LAB_00102654:
      bVar1 = false;
      goto LAB_001025fa;
    }
LAB_001025e3:
    iVar4 = vs_vlc(str,&local_48,tab);
    if (iVar4 == 0) {
      if (local_48 == 0xfffff) {
        iVar4 = vs_u(str,&local_44,6);
        if ((iVar4 == 0) && (iVar4 = vs_u(str,&local_34,8), iVar4 == 0)) {
          if ((local_34 & 0xffffff7f) != 0) {
            uVar6 = local_34 | 0xffffff00;
            if ((int)local_34 < 0x81) {
              uVar6 = local_34;
            }
            goto LAB_001026e0;
          }
          h261_block_cold_4();
        }
        goto LAB_001025f2;
      }
      if (local_48 == 0) {
        iVar3 = 0;
        if ((str->dir == VS_DECODE) && (iVar11 < 0x40)) {
          iVar3 = 0;
          memset(local_40 + iVar11,0,(ulong)(0x3f - iVar11) * 4 + 4);
          iVar11 = 0x40;
        }
        goto LAB_00102654;
      }
      iVar4 = vs_u(str,&local_38,1);
      if (iVar4 != 0) goto LAB_001025f2;
      local_44 = local_48 >> 0xc;
      uVar6 = -(local_48 & 0xfff);
      if (local_38 == 0) {
        uVar6 = local_48 & 0xfff;
      }
LAB_001026e0:
      bVar1 = true;
      if (str->dir == VS_DECODE) {
        if (0x3f < iVar11) {
          h261_block_cold_6();
          goto LAB_001025f2;
        }
        uVar9 = local_44 - 1;
        if (local_44 != 0) {
          lVar7 = 0;
          do {
            if (0x40 - (long)iVar11 == lVar7) {
              h261_block_cold_5();
              iVar11 = 0x40;
              goto LAB_001025f2;
            }
            local_40[iVar11 + lVar7] = 0;
            lVar7 = lVar7 + 1;
            uVar8 = (uint)lVar7;
          } while (local_44 != uVar8);
          iVar11 = iVar11 + uVar8;
          uVar9 = uVar9 - uVar8;
        }
        lVar7 = (long)iVar11;
        iVar11 = iVar11 + 1;
        local_40[lVar7] = uVar6;
        local_44 = uVar9;
      }
    }
    else {
LAB_001025f2:
      bVar1 = false;
      iVar3 = 1;
    }
LAB_001025fa:
    if (!bVar1) {
      return iVar3;
    }
  } while( true );
}

Assistant:

int h261_block(struct bitstream *str, int32_t *block, int intra) {
	int i = 0;
	if (intra) {
		uint32_t val = block[0];
		if (str->dir == VS_ENCODE) {
			if (val >= 0xff || val == 0) {
				fprintf(stderr, "Invalid INTRA DC coeff\n");
				return 1;
			}
			if (val == 0x80)
				val = 0xff;
		}
		if (vs_u(str, &val, 8)) return 1;
		if (str->dir == VS_DECODE) {
			if (val == 0 || val == 0x80) {
				fprintf(stderr, "Invalid INTRA DC coeff\n");
				return 1;
			}
			if (val == 0xff)
				val = 0x80;
			block[0] = val;
		}
		i = 1;
	}
	while (1) {
		uint32_t tmp, run, eb, sign;
		int32_t coeff;
		const struct vs_vlc_val *tab;
		if (i == 0)
			tab = block_0_vlc;
		else
			tab = block_vlc;
		if (str->dir == VS_ENCODE) {
			run = 0;
			while (i < 64 && !block[i])
				i++, run++;
			if (i == 64) {
				tmp = 0;
			} else {
				coeff = block[i];
				if (abs(coeff) > 127) {
					fprintf(stderr, "Coeff too large\n");
					return 1;
				}
				tmp = abs(coeff) | run << 12;
				sign = coeff < 0;
				int j;
				for (j = 0; tab[j].blen; j++) {
					if (tab[j].val == tmp) {
						break;
					}
				}
				if (!tab[j].val != tmp)
					tmp = 0xfffff;
				eb = coeff & 0xff;
				i++;
			}
		}
		if (vs_vlc(str, &tmp, tab)) return 1;
		if (tmp == 0) {
			/* end of block */
			if (str->dir == VS_DECODE) {
				while (i < 64)
					block[i++] = 0;
			}
			return 0;
		} else if (tmp == 0xfffff) {
			/* escape */
			if (vs_u(str, &run, 6)) return 1;
			if (vs_u(str, &eb, 8)) return 1;
			if (eb == 0 || eb == 0x80) {
				fprintf(stderr, "Invalid escape code\n");
				return 1;
			}
			coeff = eb;
			if (coeff > 0x80)
				coeff |= -0x100;
		} else {
			/* normal coefficient */
			if (vs_u(str, &sign, 1)) return 1;
			run = tmp >> 12;
			if (sign)
				coeff = -(tmp & 0xfff);
			else
				coeff = tmp & 0xfff;
		}
		if (str->dir == VS_DECODE) {
			if (i >= 64) {
				fprintf(stderr, "block overflow\n");
				return 1;
			}
			while (run--) {
				if (i >= 64) {
					fprintf(stderr, "block overflow\n");
					return 1;
				}
				block[i++] = 0;
			}
			block[i++] = coeff;
		}
	}
}